

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_metadata
          (ConcurrentDatabase *this,void *data_,size_t size)

{
  pointer puVar1;
  bool bVar2;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  pointer puVar3;
  uint8_t *data;
  size_t local_30;
  uint8_t *local_28;
  
  local_30 = size;
  local_28 = (uint8_t *)data_;
  bVar2 = write_exported_concurrent_metadata(this,&local_28,&local_30);
  if ((bVar2) &&
     (bVar2 = write_exported_metadata_for_db
                        ((this->readonly_interface)._M_t.
                         super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                         .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl,
                         &local_28,&local_30), bVar2)) {
    puVar3 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar3 != puVar1) {
      do {
        bVar2 = write_exported_metadata_for_db
                          ((puVar3->_M_t).
                           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                           _M_head_impl,&local_28,&local_30);
        if (!bVar2) {
          return false;
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 != puVar1);
    }
    return local_30 == 0;
  }
  return false;
}

Assistant:

bool write_exported_metadata(void *data_, size_t size) const override
	{
		auto *data = static_cast<uint8_t *>(data_);

		if (!write_exported_concurrent_metadata(data, size))
			return false;

		if (!write_exported_metadata_for_db(readonly_interface.get(), data, size))
			return false;

		for (auto &e : extra_readonly)
			if (!write_exported_metadata_for_db(e.get(), data, size))
				return false;

		return size == 0;
	}